

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O3

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform,char *name,vec4 v)

{
  float *pfVar1;
  int iVar2;
  golf_shader_uniform_member_t *pgVar3;
  long lVar4;
  golf_shader_uniform_member_t *__s1;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  lVar4 = (long)(uniform->members).length;
  if (0 < lVar4) {
    __s1 = (uniform->members).data;
    pgVar3 = (golf_shader_uniform_member_t *)0x0;
    do {
      iVar2 = strcmp(__s1->name,name);
      if ((iVar2 == 0) && (__s1->size == 0x10)) {
        pgVar3 = __s1;
      }
      __s1 = __s1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_38 = v.z;
    fStack_34 = v.w;
    local_48 = v.x;
    fStack_44 = v.y;
    if (pgVar3 != (golf_shader_uniform_member_t *)0x0) {
      pfVar1 = (float *)(uniform->data + pgVar3->offset);
      *pfVar1 = local_48;
      pfVar1[1] = fStack_44;
      pfVar1[2] = local_38;
      pfVar1[3] = fStack_34;
      return;
    }
  }
  golf_log_warning("Unable to find vec4 member: %s",name);
  return;
}

Assistant:

void golf_shader_uniform_set_vec4(golf_shader_uniform_t *uniform, const char *name, vec4 v) {
    golf_shader_uniform_member_t *member = NULL;
    for (int i = 0; i < uniform->members.length; i++) {
        if ((strcmp(uniform->members.data[i].name, name) == 0) && uniform->members.data[i].size == 16) {
            member = &uniform->members.data[i];
        }
    }
    if (!member) {
        golf_log_warning("Unable to find vec4 member: %s", name);
        return;
    }
    memcpy(uniform->data + member->offset, &v, 16);
}